

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.c
# Opt level: O0

void ecs_workers_progress(ecs_world_t *world)

{
  int32_t iVar1;
  ecs_entity_t scope;
  double dVar2;
  int local_38;
  int32_t update_count;
  int32_t sync_count;
  int32_t i;
  ecs_entity_t old_scope;
  ecs_time_t start;
  int32_t thread_count;
  ecs_entity_t pipeline;
  ecs_world_t *world_local;
  
  unique0x00012000 = world->pipeline;
  start.sec = ecs_vector_count(world->workers);
  memset((void *)((long)&old_scope + 4),0,8);
  if ((world->measure_frame_time & 1U) != 0) {
    ecs_time_measure((ecs_time_t *)((long)&old_scope + 4));
  }
  if ((int)start.sec < 2) {
    ecs_pipeline_begin(world,stack0xffffffffffffffe8);
    scope = ecs_set_scope(world,0);
    ecs_pipeline_progress(world,stack0xffffffffffffffe8,(world->stats).delta_time);
    ecs_set_scope(world,scope);
    ecs_pipeline_end(world);
  }
  else {
    local_38 = ecs_pipeline_begin(world,stack0xffffffffffffffe8);
    wait_for_workers(world);
    for (update_count = 0; update_count < local_38; update_count = update_count + 1) {
      ecs_staging_begin(world);
      world->workers_waiting = 0;
      signal_workers(world);
      wait_for_sync(world);
      ecs_staging_end(world);
      iVar1 = ecs_pipeline_update(world,stack0xffffffffffffffe8);
      if (iVar1 != 0) {
        local_38 = iVar1;
      }
    }
    ecs_pipeline_end(world);
  }
  if ((world->measure_frame_time & 1U) != 0) {
    dVar2 = ecs_time_measure((ecs_time_t *)((long)&old_scope + 4));
    (world->stats).system_time_total = (float)dVar2 + (world->stats).system_time_total;
  }
  return;
}

Assistant:

void ecs_workers_progress(
    ecs_world_t *world)
{
    ecs_entity_t pipeline = world->pipeline;
    int32_t thread_count = ecs_vector_count(world->workers);

    ecs_time_t start = {0};
    if (world->measure_frame_time) {
        ecs_time_measure(&start);
    }

    if (thread_count <= 1) {
        ecs_pipeline_begin(world, pipeline);
        ecs_entity_t old_scope = ecs_set_scope(world, 0);
        ecs_pipeline_progress(world, pipeline, world->stats.delta_time);
        ecs_set_scope(world, old_scope);
        ecs_pipeline_end(world);
    } else {
        int32_t i, sync_count = ecs_pipeline_begin(world, pipeline);

        /* Make sure workers are running and ready */
        wait_for_workers(world);

        /* Synchronize n times for each op in the pipeline */
        for (i = 0; i < sync_count; i ++) {
            ecs_staging_begin(world);

            /* Signal workers that they should start running systems */
            world->workers_waiting = 0;
            signal_workers(world);

            /* Wait until all workers are waiting on sync point */
            wait_for_sync(world);

            /* Merge */
            ecs_staging_end(world);

            int32_t update_count;
            if ((update_count = ecs_pipeline_update(world, pipeline))) {
                /* The number of operations in the pipeline could have changed
                 * as result of the merge */
                sync_count = update_count;
            }
        }

        ecs_pipeline_end(world);
    }

    if (world->measure_frame_time) {
        world->stats.system_time_total += (FLECS_FLOAT)ecs_time_measure(&start);
    }    
}